

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:569:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:569:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  uint32_t uVar1;
  value *pvVar2;
  gc_heap_ptr_untyped *this_00;
  undefined8 *puVar3;
  value *pvVar4;
  long *plVar5;
  uint32_t index;
  uint32_t index_00;
  uint uVar6;
  anon_class_16_1_570cf4e1_for_f *this_01;
  double dVar7;
  double dVar8;
  uint local_110;
  object_ptr res;
  size_type local_d8;
  pointer local_d0;
  wstring local_c8;
  wstring_view local_a8;
  wstring local_98;
  gc_heap_ptr_untyped local_78;
  value local_68;
  
  this_01 = &this->f;
  pvVar2 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar2);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
  local_c8._M_dataplus._M_p = (pointer)0x6;
  local_c8._M_string_length = 0x1f1684;
  (**(code **)*puVar3)(&local_68,puVar3);
  local_110 = to_uint32(&local_68);
  value::~value(&local_68);
  pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar4 == pvVar2) {
    uVar1 = 0;
  }
  else {
    uVar1 = anon_unknown_110::calc_start_index(pvVar2,local_110);
    pvVar2 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar4 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (1 < (ulong)(((long)pvVar4 - (long)pvVar2) / 0x28)) {
    dVar7 = to_integer(pvVar2 + 1);
    dVar8 = (double)local_110;
    if (0.0 <= dVar7) {
      if (dVar7 <= dVar8) {
        dVar8 = dVar7;
      }
    }
    else {
      dVar8 = dVar7 + dVar8;
      if (dVar8 <= 0.0) {
        dVar8 = 0.0;
      }
    }
    local_110 = (uint)(long)dVar8;
  }
  make_array((gc_heap_ptr<mjs::global_object> *)&res,(uint32_t)this_01);
  h = (this_01->global).super_gc_heap_ptr_untyped.heap_;
  for (uVar6 = 0; uVar1 + uVar6 < local_110; uVar6 = uVar6 + 1) {
    plVar5 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
    index_string_abi_cxx11_(&local_c8,(mjs *)(ulong)uVar6,index);
    local_a8._M_len = local_c8._M_string_length;
    local_a8._M_str = local_c8._M_dataplus._M_p;
    string::string((string *)&local_78,h,&local_a8);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
    index_string_abi_cxx11_(&local_98,(mjs *)(ulong)(uVar1 + uVar6),index_00);
    local_d8 = local_98._M_string_length;
    local_d0 = local_98._M_dataplus._M_p;
    (**(code **)*puVar3)(&local_68,puVar3,&local_d8);
    (**(code **)(*plVar5 + 8))(plVar5,&local_78,&local_68,0);
    value::~value(&local_68);
    std::__cxx11::wstring::~wstring((wstring *)&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
  }
  value::value(__return_storage_ptr__,&res);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&res.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }